

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

_Bool has_patched_distance(pfdistances_patched *distances,loc grid)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t patchx;
  wchar_t patchy;
  pfdistances_patched *distances_local;
  loc grid_local;
  
  distances_local._4_4_ = grid.y;
  if (((((long)grid < 0) || (distances->height <= distances_local._4_4_)) ||
      (distances_local._0_4_ = grid.x, (wchar_t)distances_local < L'\0')) ||
     (distances->width <= (wchar_t)distances_local)) {
    __assert_fail("grid.y >= 0 && grid.y < distances->height && grid.x >= 0 && grid.x < distances->width"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                  ,699,"_Bool has_patched_distance(const struct pfdistances_patched *, struct loc)")
    ;
  }
  wVar1 = distances_local._4_4_ >> ((byte)distances->patch_shift & 0x1f);
  if ((wVar1 < L'\0') || (distances->npatchy <= wVar1)) {
    __assert_fail("patchy >= 0 && patchy < distances->npatchy",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                  ,0x2bd,
                  "_Bool has_patched_distance(const struct pfdistances_patched *, struct loc)");
  }
  wVar2 = (wchar_t)distances_local >> ((byte)distances->patch_shift & 0x1f);
  if ((L'\xffffffff' < wVar2) && (wVar2 < distances->npatchx)) {
    return distances->patches[wVar1][wVar2] != (int *)0x0;
  }
  __assert_fail("patchx >= 0 && patchx < distances->npatchx",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                ,0x2bf,"_Bool has_patched_distance(const struct pfdistances_patched *, struct loc)")
  ;
}

Assistant:

static bool has_patched_distance(const struct pfdistances_patched *distances,
		struct loc grid)
{
	int patchy, patchx;

	assert(grid.y >= 0 && grid.y < distances->height
		&& grid.x >= 0 && grid.x < distances->width);
	patchy = grid.y >> distances->patch_shift;
	assert(patchy >= 0 && patchy < distances->npatchy);
	patchx = grid.x >> distances->patch_shift;
	assert(patchx >= 0 && patchx < distances->npatchx);
	return distances->patches[patchy][patchx];
}